

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_SetGlobalVar(JSContext *ctx,JSAtom prop,JSValue val,int flag)

{
  void *pvVar1;
  long lVar2;
  JSStackFrame *pJVar3;
  long lVar4;
  int64_t iVar5;
  JSValueUnion JVar6;
  int iVar7;
  JSRefCountHeader *p;
  JSValueUnion JVar8;
  long lVar9;
  uint uVar10;
  JSValueUnion *pJVar11;
  ulong uVar12;
  JSValue v;
  
  JVar8 = val.u;
  pvVar1 = (ctx->global_var_obj).u.ptr;
  lVar2 = *(long *)((long)pvVar1 + 0x18);
  uVar10 = *(uint *)(lVar2 + ~(ulong)(*(uint *)(lVar2 + 0x20) & prop) * 4);
  while( true ) {
    if (uVar10 == 0) {
      pJVar3 = ctx->rt->current_stack_frame;
      if ((pJVar3 == (JSStackFrame *)0x0) || (iVar7 = 0x18000, (pJVar3->js_mode & 1U) == 0)) {
        iVar7 = 0x8000;
      }
      iVar7 = JS_SetPropertyInternal(ctx,ctx->global_obj,prop,val,iVar7);
      return iVar7;
    }
    uVar12 = (ulong)uVar10;
    if (*(JSAtom *)(lVar2 + 0x3c + uVar12 * 8) == prop) break;
    uVar10 = *(uint *)(lVar2 + 0x38 + uVar12 * 8) & 0x3ffffff;
  }
  lVar4 = *(long *)((long)pvVar1 + 0x20);
  lVar9 = (uVar12 - 1) * 0x10;
  iVar5 = *(int64_t *)(lVar4 + 8 + lVar9);
  uVar10 = (uint)iVar5;
  if (flag != 1) {
    if (uVar10 == 4) {
      if ((0xfffffff4 < (uint)val.tag) &&
         (iVar7 = *JVar8.ptr, *(int *)JVar8.ptr = iVar7 + -1, iVar7 < 2)) {
        __JS_FreeValueRT(ctx->rt,val);
        prop = *(JSAtom *)(lVar2 + 0x3c + uVar12 * 8);
      }
      JS_ThrowReferenceErrorUninitialized(ctx,prop);
    }
    else {
      if ((*(byte *)(lVar2 + 0x3b + uVar12 * 8) & 8) != 0) goto LAB_00137394;
      JS_SetGlobalVar_cold_1();
    }
    return -1;
  }
LAB_00137394:
  pJVar11 = (JSValueUnion *)(lVar4 + lVar9);
  JVar6.ptr = pJVar11->ptr;
  pJVar11->ptr = (void *)JVar8;
  pJVar11[1] = (JSValueUnion)val.tag;
  if (uVar10 < 0xfffffff5) {
    return 0;
  }
  iVar7 = *JVar6.ptr;
  *(int *)JVar6.ptr = iVar7 + -1;
  if (1 < iVar7) {
    return 0;
  }
  v.tag = iVar5;
  v.u.ptr = JVar6.ptr;
  __JS_FreeValueRT(ctx->rt,v);
  return 0;
}

Assistant:

static int JS_SetGlobalVar(JSContext *ctx, JSAtom prop, JSValue val,
                           int flag)
{
    JSObject *p;
    JSShapeProperty *prs;
    JSProperty *pr;
    int flags;

    /* no exotic behavior is possible in global_var_obj */
    p = JS_VALUE_GET_OBJ(ctx->global_var_obj);
    prs = find_own_property(&pr, p, prop);
    if (prs) {
        /* XXX: should handle JS_PROP_AUTOINIT properties? */
        if (flag != 1) {
            if (unlikely(JS_IsUninitialized(pr->u.value))) {
                JS_FreeValue(ctx, val);
                JS_ThrowReferenceErrorUninitialized(ctx, prs->atom);
                return -1;
            }
            if (unlikely(!(prs->flags & JS_PROP_WRITABLE))) {
                JS_FreeValue(ctx, val);
                return JS_ThrowTypeErrorReadOnly(ctx, JS_PROP_THROW, prop);
            }
        }
        set_value(ctx, &pr->u.value, val);
        return 0;
    }
    flags = JS_PROP_THROW_STRICT;
    if (is_strict_mode(ctx)) 
        flags |= JS_PROP_NO_ADD;
    return JS_SetPropertyInternal(ctx, ctx->global_obj, prop, val, flags);
}